

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftpserver.c
# Opt level: O1

void uss_realpath(SftpServer *srv,SftpReplyBuilder *reply,ptrlen path)

{
  char *__name;
  char *__s;
  size_t sVar1;
  SftpReplyBuilder *reply_00;
  ptrlen pVar2;
  
  __name = mkstr(path);
  reply_00 = (SftpReplyBuilder *)0x0;
  __s = realpath(__name,(char *)0x0);
  free(__name);
  if (__s != (char *)0x0) {
    sVar1 = strlen(__s);
    pVar2.len = sVar1;
    pVar2.ptr = __s;
    (*reply->vt->reply_simple_name)(reply,pVar2);
    free(__s);
    return;
  }
  uss_error((UnixSftpServer *)reply,reply_00);
  return;
}

Assistant:

static void uss_realpath(SftpServer *srv, SftpReplyBuilder *reply,
                         ptrlen path)
{
    UnixSftpServer *uss = container_of(srv, UnixSftpServer, srv);

    char *inpath = mkstr(path);
    char *outpath = realpath(inpath, NULL);
    free(inpath);

    if (!outpath) {
        uss_error(uss, reply);
    } else {
        fxp_reply_simple_name(reply, ptrlen_from_asciz(outpath));
        free(outpath);
    }
}